

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall
IR::Instr::ConvertToBailOutInstr
          (Instr *this,Instr *bailOutTarget,BailOutKind kind,uint32 bailOutOffset)

{
  JitArenaAllocator *pJVar1;
  BailOutInfo *this_00;
  Instr *pIVar2;
  uint32 local_8c;
  TrackAllocData local_58;
  BailOutInfo *local_30;
  BailOutInfo *bailOutInfo;
  Func *func;
  uint32 bailOutOffset_local;
  BailOutKind kind_local;
  Instr *bailOutTarget_local;
  Instr *this_local;
  
  bailOutInfo = (BailOutInfo *)bailOutTarget->m_func;
  pJVar1 = ((Func *)bailOutInfo)->m_alloc;
  func._0_4_ = bailOutOffset;
  func._4_4_ = kind;
  _bailOutOffset_local = bailOutTarget;
  bailOutTarget_local = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&BailOutInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0xc9d);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_58);
  this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,pJVar1,0x4e98c0);
  if ((uint32)func == 0xffffffff) {
    local_8c = GetByteCodeOffset(_bailOutOffset_local);
  }
  else {
    local_8c = (uint32)func;
  }
  BailOutInfo::BailOutInfo(this_00,local_8c,(Func *)bailOutInfo);
  this_00->bailOutOpcode = this->m_opcode;
  local_30 = this_00;
  pIVar2 = ConvertToBailOutInstr(this,this_00,func._4_4_,false);
  return pIVar2;
}

Assistant:

IR::Instr *
Instr::ConvertToBailOutInstr(IR::Instr * bailOutTarget, IR::BailOutKind kind, uint32 bailOutOffset)
{
    Func * func = bailOutTarget->m_func;
    BailOutInfo * bailOutInfo = JitAnew(func->m_alloc, BailOutInfo, bailOutOffset == Js::Constants::NoByteCodeOffset ? bailOutTarget->GetByteCodeOffset() : bailOutOffset , func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = this->m_opcode;
#endif
    return this->ConvertToBailOutInstr(bailOutInfo, kind);
}